

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

bool sect_IsSizeKnown(Section *sect)

{
  int iVar1;
  SectionStackEntry *local_20;
  SectionStackEntry *stack;
  Section *sect_local;
  
  if (sect->modifier == SECTION_NORMAL) {
    if ((sect == currentSection) || (sect == currentLoadSection)) {
      sect_local._7_1_ = false;
    }
    else {
      for (local_20 = sectionStack; local_20 != (SectionStackEntry *)0x0; local_20 = local_20->next)
      {
        if ((local_20->section != (Section *)0x0) &&
           (iVar1 = strcmp(sect->name,local_20->section->name), iVar1 == 0)) {
          return false;
        }
      }
      sect_local._7_1_ = true;
    }
  }
  else {
    sect_local._7_1_ = false;
  }
  return sect_local._7_1_;
}

Assistant:

bool sect_IsSizeKnown(struct Section const NONNULL(sect))
{
	// SECTION UNION and SECTION FRAGMENT can still grow
	if (sect->modifier != SECTION_NORMAL)
		return false;

	// The current section (or current load section if within one) is still growing
	if (sect == currentSection || sect == currentLoadSection)
		return false;

	// Any section on the stack is still growing
	for (struct SectionStackEntry *stack = sectionStack; stack; stack = stack->next) {
		if (stack->section && !strcmp(sect->name, stack->section->name))
			return false;
	}

	return true;
}